

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O3

void __thiscall xLearn::Model::Serialize(Model *this,string *filename)

{
  FILE *file_ptr;
  ostream *poVar1;
  Logger local_64;
  string local_60;
  string local_40;
  
  if (filename->_M_string_length != 0) {
    file_ptr = OpenFileOrDie((filename->_M_dataplus)._M_p,"w");
    WriteStringToFile(file_ptr,&this->score_func_);
    WriteStringToFile(file_ptr,&this->loss_func_);
    WriteDataToDisk(file_ptr,(char *)&this->num_feat_,4);
    WriteDataToDisk(file_ptr,(char *)&this->num_field_,4);
    WriteDataToDisk(file_ptr,(char *)&this->num_K_,4);
    WriteDataToDisk(file_ptr,(char *)&this->aux_size_,4);
    serialize_w_v_b(this,file_ptr);
    Close(file_ptr);
    return;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_64.severity_ = ERR;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters.cc"
             ,"");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Serialize","");
  poVar1 = Logger::Start(ERR,&local_40,0xd6,&local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"CHECK_NE failed ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters.cc"
             ,0x66);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0xd6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"filename.empty()",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"true",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  Logger::~Logger(&local_64);
  abort();
}

Assistant:

void Model::Serialize(const std::string& filename) {
  CHECK_NE(filename.empty(), true);
#ifndef _MSC_VER
  FILE* file = OpenFileOrDie(filename.c_str(), "w");
#else
  FILE *file = OpenFileOrDie(filename.c_str(), "wb");
#endif
  // Write score function
  WriteStringToFile(file, score_func_);
  // Write loss function
  WriteStringToFile(file, loss_func_);
  // Write feature num
  WriteDataToDisk(file, (char*)&num_feat_, sizeof(num_feat_));
  // Write field num
  WriteDataToDisk(file, (char*)&num_field_, sizeof(num_field_));
  // Write K
  WriteDataToDisk(file, (char*)&num_K_, sizeof(num_K_));
  // Write aux_size
  WriteDataToDisk(file, (char*)&aux_size_, sizeof(aux_size_));
  // Write w
  this->serialize_w_v_b(file);
  Close(file);
}